

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O2

child_tags_list_t * __thiscall
cfgfile::
tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_cfgfile::string_trait_t>
::children(tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_cfgfile::string_trait_t>
           *this)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::string,cfgfile::string_trait_t>,cfgfile::string_trait_t>
      ::children()::empty == '\0') {
    iVar2 = __cxa_guard_acquire(&tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::string,cfgfile::string_trait_t>,cfgfile::string_trait_t>
                                 ::children()::empty);
    if (iVar2 != 0) {
      children::empty.
      super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      children::empty.
      super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      children::empty.
      super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(std::
                   vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                   ::~vector,&children::empty,&__dso_handle);
      __cxa_guard_release(&tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::string,cfgfile::string_trait_t>,cfgfile::string_trait_t>
                           ::children()::empty);
    }
  }
  peVar1 = (this->m_current).
           super___shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*(peVar1->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])();
    return (child_tags_list_t *)CONCAT44(extraout_var,iVar2);
  }
  return &children::empty;
}

Assistant:

const typename tag_t< Trait >::child_tags_list_t & children() const override
	{
		static const typename tag_t< Trait >::child_tags_list_t empty;

		if( m_current )
			return m_current->children();
		else
			return empty;
	}